

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

SchnorrPubkey * __thiscall
cfd::core::TapBranch::GetTweakedPubkey
          (SchnorrPubkey *__return_storage_ptr__,TapBranch *this,SchnorrPubkey *internal_pubkey,
          bool *parity)

{
  undefined1 local_40 [8];
  ByteData256 hash;
  bool *parity_local;
  SchnorrPubkey *internal_pubkey_local;
  TapBranch *this_local;
  
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = parity;
  GetTapTweak((ByteData256 *)local_40,this,internal_pubkey);
  SchnorrPubkey::CreateTweakAdd
            (__return_storage_ptr__,internal_pubkey,(ByteData256 *)local_40,
             (bool *)hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData256::~ByteData256((ByteData256 *)local_40);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey TapBranch::GetTweakedPubkey(
    const SchnorrPubkey& internal_pubkey, bool* parity) const {
  ByteData256 hash = GetTapTweak(internal_pubkey);
  return internal_pubkey.CreateTweakAdd(hash, parity);
}